

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O1

void google::protobuf::compiler::anon_unknown_0::ConvertToDynamicMessageAndStripOptions
               (Message *m,DescriptorPool *pool,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *stripped_paths)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Descriptor *type;
  DescriptorPool *pDVar3;
  MessageLite *pMVar4;
  string_view sVar5;
  string_view data;
  string_view data_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  string serialized;
  vector<int,_std::allocator<int>_> path;
  DynamicMessageFactory factory;
  LogMessage LStack_a8;
  string local_98;
  vector<int,_std::allocator<int>_> local_78;
  DynamicMessageFactory local_60;
  
  sVar5 = MessageLite::GetTypeName(&m->super_MessageLite);
  type = DescriptorPool::FindMessageTypeByName(pool,sVar5);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (type != (Descriptor *)0x0) {
    pDVar3 = DescriptorPool::generated_pool();
    if (pDVar3 != pool) {
      DynamicMessageFactory::DynamicMessageFactory(&local_60);
      pMVar4 = &DynamicMessageFactory::GetPrototype(&local_60,type)->super_MessageLite;
      pMVar4 = MessageLite::New(pMVar4,(Arena *)0x0);
      paVar1 = &local_98.field_2;
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      local_98._M_dataplus._M_p = (pointer)paVar1;
      bVar2 = MessageLite::SerializePartialToString(&m->super_MessageLite,&local_98);
      if (bVar2) {
        data._M_str = local_98._M_dataplus._M_p;
        data._M_len = local_98._M_string_length;
        bVar2 = MessageLite::ParsePartialFromString(pMVar4,data);
        if (!bVar2) {
          bVar2 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                            (&(anonymous_namespace)::
                              ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                              ::absl_log_internal_stateful_condition_state,1.0);
          if (bVar2) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&LStack_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                       ,0x7f);
            str._M_str = "Failed to fully strip source-retention options";
            str._M_len = 0x2e;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&LStack_a8,str);
            goto LAB_00147306;
          }
          goto LAB_0014730e;
        }
        StripMessage((Message *)pMVar4,&local_78,stripped_paths);
        bVar2 = MessageLite::SerializePartialToString(pMVar4,&local_98);
        if (!bVar2) {
          bVar2 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                            (&(anonymous_namespace)::
                              ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                              ::absl_log_internal_stateful_condition_state,1.0);
          if (bVar2) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&LStack_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                       ,0x86);
            str_00._M_str = "Failed to fully strip source-retention options";
            str_00._M_len = 0x2e;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&LStack_a8,str_00);
            goto LAB_00147306;
          }
          goto LAB_0014730e;
        }
        data_00._M_str = local_98._M_dataplus._M_p;
        data_00._M_len = local_98._M_string_length;
        bVar2 = MessageLite::ParsePartialFromString(&m->super_MessageLite,data_00);
        if (!bVar2) {
          bVar2 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                            (&(anonymous_namespace)::
                              ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                              ::absl_log_internal_stateful_condition_state,1.0);
          if (bVar2) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&LStack_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                       ,0x8c);
            str_01._M_str = "Failed to fully strip source-retention options";
            str_01._M_len = 0x2e;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&LStack_a8,str_01);
            goto LAB_00147306;
          }
          goto LAB_0014730e;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
LAB_0014733a:
        (*pMVar4->_vptr_MessageLite[1])(pMVar4);
      }
      else {
        bVar2 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                          (&ConvertToDynamicMessageAndStripOptions::
                            absl_log_internal_stateful_condition_state,1.0);
        if (bVar2) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&LStack_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                     ,0x79);
          sVar5._M_str = "Failed to fully strip source-retention options";
          sVar5._M_len = 0x2e;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (&LStack_a8,sVar5);
LAB_00147306:
          absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_a8);
        }
LAB_0014730e:
        StripMessage(m,&local_78,stripped_paths);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
        if (pMVar4 != (MessageLite *)0x0) goto LAB_0014733a;
      }
      DynamicMessageFactory::~DynamicMessageFactory(&local_60);
      goto LAB_0014734d;
    }
  }
  StripMessage(m,&local_78,stripped_paths);
LAB_0014734d:
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ConvertToDynamicMessageAndStripOptions(
    Message& m, const DescriptorPool& pool,
    std::vector<std::vector<int>>* stripped_paths = nullptr) {
  // We need to look up the descriptor in the pool so that we can get a
  // descriptor which knows about any custom options that were used in the
  // .proto file.
  const Descriptor* descriptor = pool.FindMessageTypeByName(m.GetTypeName());
  std::vector<int> path;

  if (descriptor == nullptr || &pool == DescriptorPool::generated_pool()) {
    // If the pool does not contain the descriptor, then this proto file does
    // not transitively depend on descriptor.proto, in which case we know there
    // are no custom options to worry about. If we are working with the
    // generated pool, then we can still access any custom options without
    // having to resort to DynamicMessage.
    StripMessage(m, path, stripped_paths);
  } else {
    // To convert to a dynamic message, we need to serialize the original
    // descriptor and parse it back again. This can fail if the descriptor is
    // invalid, so in that case we try to handle it gracefully by stripping the
    // original descriptor without using DynamicMessage. In this situation we
    // will generally not be able to strip custom options, but we can at least
    // strip built-in options.
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_message(
        factory.GetPrototype(descriptor)->New());
    std::string serialized;
    if (!m.SerializePartialToString(&serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
    if (!dynamic_message->ParsePartialFromString(serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
    StripMessage(*dynamic_message, path, stripped_paths);
    if (!dynamic_message->SerializePartialToString(&serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
    if (!m.ParsePartialFromString(serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
  }
}